

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v128_intrinsics_c.h
# Opt level: O1

c_v128 c_v128_padd_s16(c_v128 a)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  c_v128 cVar5;
  
  auVar2._8_8_ = 0;
  auVar2._0_8_ = a.u64[1];
  auVar3._8_8_ = 0;
  auVar3._0_8_ = a.u64[0];
  auVar1 = vpunpcklqdq_avx(auVar3,auVar2);
  auVar2 = vpshufd_avx(auVar1,0xe8);
  auVar3 = vpsrlq_avx(auVar1,0x10);
  auVar4 = vpslld_avx(auVar2,0x10);
  auVar4 = vpsrad_avx(auVar4,0x10);
  auVar2 = vpsrad_avx(auVar2,0x10);
  auVar2 = vpaddd_avx(auVar4,auVar2);
  auVar3 = vpshufd_avx(auVar3,0xe8);
  auVar4 = vpsrad_avx(auVar3,0x10);
  auVar3 = vpshufd_avx(auVar1,0xed);
  auVar3 = vpsrad_avx(auVar3,0x10);
  auVar3 = vpaddd_avx(auVar4,auVar3);
  auVar2 = vpunpckldq_avx(auVar2,auVar3);
  cVar5._8_8_ = vpextrq_avx(auVar2,1);
  cVar5.u64[0] = auVar2._0_8_;
  return cVar5;
}

Assistant:

SIMD_INLINE c_v128 c_v128_padd_s16(c_v128 a) {
  c_v128 t;
  t.s32[0] = (int32_t)a.s16[0] + (int32_t)a.s16[1];
  t.s32[1] = (int32_t)a.s16[2] + (int32_t)a.s16[3];
  t.s32[2] = (int32_t)a.s16[4] + (int32_t)a.s16[5];
  t.s32[3] = (int32_t)a.s16[6] + (int32_t)a.s16[7];
  return t;
}